

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.h
# Opt level: O0

void __thiscall ONX_ModelTest::ONX_ModelTest(ONX_ModelTest *this)

{
  ON_SHA1_Hash *local_98;
  shared_ptr<ONX_Model> *local_78;
  ONX_ErrorCounter *local_60;
  Result *local_50;
  uint *local_28;
  ONX_ModelTest *this_local;
  
  this->m_test_type = Unset;
  ON_wString::ON_wString(&this->m_source_3dm_file_path);
  ON_wString::ON_wString(&this->m_text_log_3dm_file_path);
  this->m_model_3dm_file_version[0] = 0;
  local_28 = this->m_model_3dm_file_version + 1;
  do {
    *local_28 = 0;
    local_28 = local_28 + 1;
  } while (local_28 != &this->m_current_test_index);
  this->m_current_test_index = 0;
  this->m_test_result = Unset;
  local_50 = this->m_test_results;
  do {
    *local_50 = Unset;
    local_50 = local_50 + 1;
  } while ((ONX_ErrorCounter *)local_50 != &this->m_error_count);
  ONX_ErrorCounter::ONX_ErrorCounter(&this->m_error_count);
  local_60 = this->m_error_counts;
  do {
    ONX_ErrorCounter::ONX_ErrorCounter(local_60);
    local_60 = local_60 + 1;
  } while (local_60 != (ONX_ErrorCounter *)this->m_model);
  local_78 = this->m_model;
  do {
    std::shared_ptr<ONX_Model>::shared_ptr(local_78);
    local_78 = local_78 + 1;
  } while ((ON_SHA1_Hash *)local_78 != this->m_model_hash);
  local_98 = this->m_model_hash;
  do {
    ON_SHA1_Hash::ON_SHA1_Hash(local_98);
    local_98 = local_98 + 1;
  } while (local_98 != (ON_SHA1_Hash *)&this->field_0x15c);
  return;
}

Assistant:

~ONX_ModelTest() = default;